

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiddle~.c
# Opt level: O1

void sigfiddle_reattack(t_sigfiddle *x,t_floatarg attacktime,t_floatarg attackthresh)

{
  int iVar1;
  int iVar2;
  float fVar3;
  
  fVar3 = 0.0;
  if (0.0 <= attacktime) {
    fVar3 = attacktime;
  }
  x->x_attacktime = (int)fVar3;
  x->x_attackthresh =
       (t_float)(~-(uint)(0.0 < attackthresh) & 0x447a0000 |
                (uint)attackthresh & -(uint)(0.0 < attackthresh));
  iVar1 = (int)((fVar3 * x->x_sr * 0.001) / (float)x->x_hop);
  iVar2 = 0x13;
  if (iVar1 < 0x13) {
    iVar2 = iVar1;
  }
  x->x_attackbins = iVar2;
  return;
}

Assistant:

void sigfiddle_reattack(t_sigfiddle *x,
    t_floatarg attacktime, t_floatarg attackthresh)
{
    if (attacktime < 0) attacktime = 0;
    if (attackthresh <= 0) attackthresh = 1000;
    x->x_attacktime = attacktime;
    x->x_attackthresh = attackthresh;
    x->x_attackbins = (x->x_sr * 0.001 * attacktime) / x->x_hop;
    if (x->x_attackbins >= HISTORY) x->x_attackbins = HISTORY - 1;
}